

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O0

void fy_diag_cfg_default(fy_diag_cfg *cfg)

{
  int iVar1;
  fy_diag_cfg *cfg_local;
  
  if (cfg != (fy_diag_cfg *)0x0) {
    memset(cfg,0,0x38);
    cfg->fp = (FILE *)_stderr;
    fy_diag_cfg_from_parser_flags
              (cfg,FYPCF_DEBUG_DIAG_TYPE|FYPCF_DEBUG_LEVEL_INFO|FYPCF_DEBUG_SYSTEM|
                   FYPCF_DEBUG_INTERNAL|FYPCF_DEBUG_BUILD|FYPCF_DEBUG_DOC|FYPCF_DEBUG_PARSE|
                   FYPCF_DEBUG_SCAN|FYPCF_DEBUG_ATOM|FYPCF_DEBUG_UNKNOWN);
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    cfg->field_0x20 = cfg->field_0x20 & 0xfe | iVar1 == 1;
    fy_diag_cfg_default_widths(cfg);
  }
  return;
}

Assistant:

void fy_diag_cfg_default(struct fy_diag_cfg *cfg) {
    if (!cfg)
        return;

    memset(cfg, 0, sizeof(*cfg));

    cfg->fp = stderr;
    fy_diag_cfg_from_parser_flags(cfg, FYPCF_DEFAULT_PARSE);
    cfg->colorize = isatty(fileno(stderr)) == 1;
    fy_diag_cfg_default_widths(cfg);
}